

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::generateIterations
          (TextureGather2DCase *this)

{
  GatherType gatherType;
  undefined1 local_70 [16];
  _Alloc_hider _Stack_60;
  pointer local_58;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  local_48;
  
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)local_70);
  generateBasic2DCaseIterations
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
              *)(local_70 + 8),gatherType,&(this->super_TextureGatherCase).m_textureFormat,
             (IVec2 *)local_70);
  local_48.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_iterations).
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_iterations).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
  local_48.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->m_iterations).
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->m_iterations).
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_iterations).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_70._8_8_;
  (this->m_iterations).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_60._M_p;
  local_70._8_8_ = (TestContext *)0x0;
  _Stack_60._M_p = (pointer)0x0;
  local_58 = (pointer)0x0;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ::~vector(&local_48);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
             *)(local_70 + 8));
  return;
}

Assistant:

void TextureGather2DCase::generateIterations (void)
{
	DE_ASSERT(m_iterations.empty());
	m_iterations = generateBasic2DCaseIterations(m_gatherType, m_textureFormat, getOffsetRange());
}